

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

void * mz_zip_extract_archive_file_to_heap
                 (char *pZip_filename,char *pArchive_name,size_t *pSize,mz_uint flags)

{
  mz_bool mVar1;
  mz_uint file_index;
  void *pvVar2;
  mz_zip_archive zip_archive;
  mz_zip_archive local_88;
  
  if (pSize != (size_t *)0x0) {
    *pSize = 0;
  }
  if (pArchive_name != (char *)0x0 && pZip_filename != (char *)0x0) {
    local_88.m_pIO_opaque = (void *)0x0;
    local_88.m_pState = (mz_zip_internal_state *)0x0;
    local_88.m_pRead = (mz_file_read_func)0x0;
    local_88.m_pWrite = (mz_file_write_func)0x0;
    local_88.m_pRealloc = (mz_realloc_func)0x0;
    local_88.m_pAlloc_opaque = (void *)0x0;
    local_88.m_pAlloc = (mz_alloc_func)0x0;
    local_88.m_pFree = (mz_free_func)0x0;
    local_88.m_total_files = 0;
    local_88.m_zip_mode = MZ_ZIP_MODE_INVALID;
    local_88.m_file_offset_alignment = 0;
    local_88._28_4_ = 0;
    local_88.m_archive_size = 0;
    local_88.m_central_directory_file_ofs = 0;
    mVar1 = mz_zip_reader_init_file(&local_88,pZip_filename,flags | 0x800);
    if (mVar1 != 0) {
      pvVar2 = (void *)0x0;
      file_index = mz_zip_reader_locate_file(&local_88,pArchive_name,(char *)0x0,flags);
      if (-1 < (int)file_index) {
        pvVar2 = mz_zip_reader_extract_to_heap(&local_88,file_index,pSize,flags);
      }
      mz_zip_reader_end(&local_88);
      return pvVar2;
    }
  }
  return (void *)0x0;
}

Assistant:

void *mz_zip_extract_archive_file_to_heap(const char *pZip_filename,
                                          const char *pArchive_name,
                                          size_t *pSize, mz_uint flags) {
  int file_index;
  mz_zip_archive zip_archive;
  void *p = NULL;

  if (pSize) *pSize = 0;

  if ((!pZip_filename) || (!pArchive_name)) return NULL;

  MZ_CLEAR_OBJ(zip_archive);
  if (!mz_zip_reader_init_file(
          &zip_archive, pZip_filename,
          flags | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY))
    return NULL;

  if ((file_index = mz_zip_reader_locate_file(&zip_archive, pArchive_name, NULL,
                                              flags)) >= 0)
    p = mz_zip_reader_extract_to_heap(&zip_archive, file_index, pSize, flags);

  mz_zip_reader_end(&zip_archive);
  return p;
}